

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

int Cbs0_ManPropagateOne(Cbs0_Man_t *p,Gia_Obj_t *pVar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int Value1;
  int Value0;
  Gia_Obj_t *pVar_local;
  Cbs0_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pVar);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x1d4,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Cbs0_VarIsAssigned(pVar);
  if (iVar1 == 0) {
    __assert_fail("Cbs0_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x1d5,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsCi(pVar);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAnd(pVar);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                    ,0x1d8,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Cbs0_VarFanin0Value(pVar);
    iVar2 = Cbs0_VarFanin1Value(pVar);
    iVar3 = Cbs0_VarValue(pVar);
    if (iVar3 == 0) {
      if ((iVar1 == 0) || (iVar2 == 0)) {
        p_local._4_4_ = 0;
      }
      else if ((iVar1 == 1) && (iVar2 == 1)) {
        p_local._4_4_ = 1;
      }
      else if ((iVar1 == 1) || (iVar2 == 1)) {
        if (iVar1 == 2) {
          pGVar4 = Gia_ObjChild0(pVar);
          pGVar4 = Gia_Not(pGVar4);
          Cbs0_ManAssign(p,pGVar4);
        }
        if (iVar2 == 2) {
          pGVar4 = Gia_ObjChild1(pVar);
          pGVar4 = Gia_Not(pGVar4);
          Cbs0_ManAssign(p,pGVar4);
        }
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Cbs0_VarIsJust(pVar);
        if (iVar1 == 0) {
          __assert_fail("Cbs0_VarIsJust(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                        ,0x1f2,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        iVar1 = Cbs0_QueHasNode(&p->pJust,pVar);
        if (iVar1 != 0) {
          __assert_fail("!Cbs0_QueHasNode( &p->pJust, pVar )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                        ,499,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        Cbs0_QuePush(&p->pJust,pVar);
        p_local._4_4_ = 0;
      }
    }
    else if ((iVar1 == 0) || (iVar2 == 0)) {
      p_local._4_4_ = 1;
    }
    else {
      if (iVar1 == 2) {
        pGVar4 = Gia_ObjChild0(pVar);
        Cbs0_ManAssign(p,pGVar4);
      }
      if (iVar2 == 2) {
        pGVar4 = Gia_ObjChild1(pVar);
        Cbs0_ManAssign(p,pGVar4);
      }
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Cbs0_ManPropagateOne( Cbs0_Man_t * p, Gia_Obj_t * pVar )
{
    int Value0, Value1;
    assert( !Gia_IsComplement(pVar) );
    assert( Cbs0_VarIsAssigned(pVar) );
    if ( Gia_ObjIsCi(pVar) )
        return 0;
    assert( Gia_ObjIsAnd(pVar) );
    Value0 = Cbs0_VarFanin0Value(pVar);
    Value1 = Cbs0_VarFanin1Value(pVar);
    if ( Cbs0_VarValue(pVar) )
    { // value is 1
        if ( Value0 == 0 || Value1 == 0 ) // one is 0
            return 1;
        if ( Value0 == 2 ) // first is unassigned
            Cbs0_ManAssign( p, Gia_ObjChild0(pVar) );
        if ( Value1 == 2 ) // first is unassigned
            Cbs0_ManAssign( p, Gia_ObjChild1(pVar) );
        return 0;
    }
    // value is 0
    if ( Value0 == 0 || Value1 == 0 ) // one is 0
        return 0;
    if ( Value0 == 1 && Value1 == 1 ) // both are 1
        return 1;
    if ( Value0 == 1 || Value1 == 1 ) // one is 1 
    {
        if ( Value0 == 2 ) // first is unassigned
            Cbs0_ManAssign( p, Gia_Not(Gia_ObjChild0(pVar)) );
        if ( Value1 == 2 ) // first is unassigned
            Cbs0_ManAssign( p, Gia_Not(Gia_ObjChild1(pVar)) );
        return 0;
    }
    assert( Cbs0_VarIsJust(pVar) );
    assert( !Cbs0_QueHasNode( &p->pJust, pVar ) );
    Cbs0_QuePush( &p->pJust, pVar );
    return 0;
}